

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

wchar_t player_apply_damage_reduction(player *p,wchar_t dam)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  if ((dam < L'⌨') && (p->timed[0xc] != 0)) {
    return L'\0';
  }
  wVar1 = (p->state).dam_red;
  wVar2 = dam - wVar1;
  if ((wVar2 != L'\0' && wVar1 <= dam) && (wVar1 = (p->state).perc_dam_red, wVar1 != L'\0')) {
    wVar2 = wVar2 + (wVar1 * wVar2) / -100;
  }
  wVar1 = L'\0';
  if (L'\0' < wVar2) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

int player_apply_damage_reduction(struct player *p, int dam)
{
	/* Mega-Hack -- Apply "invulnerability" */
	if (p->timed[TMD_INVULN] && (dam < 9000)) return 0;

	dam -= p->state.dam_red;
	if (dam > 0 && p->state.perc_dam_red) {
		dam -= (dam * p->state.perc_dam_red) / 100 ;
	}

	return (dam < 0) ? 0 : dam;
}